

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

istream * tinyobj::safeGetline(istream *is,string *t)

{
  long *plVar1;
  byte *pbVar2;
  int iVar3;
  undefined8 in_RAX;
  istream *piVar4;
  sentry local_21 [8];
  sentry se;
  
  local_21[0] = SUB81((ulong)in_RAX >> 0x38,0);
  t->_M_string_length = 0;
  *(t->_M_dataplus)._M_p = '\0';
  piVar4 = (istream *)std::istream::sentry::sentry(local_21,is,true);
  if (local_21[0] == (sentry)0x1) {
    plVar1 = *(long **)(is + *(long *)(*(long *)is + -0x18) + 0xe8);
    while( true ) {
      pbVar2 = (byte *)plVar1[2];
      if (pbVar2 < (byte *)plVar1[3]) {
        piVar4 = (istream *)(ulong)*pbVar2;
        plVar1[2] = (long)(pbVar2 + 1);
      }
      else {
        piVar4 = (istream *)(**(code **)(*plVar1 + 0x50))(plVar1);
      }
      iVar3 = (int)piVar4;
      if (iVar3 == -1) {
        if (t->_M_string_length != 0) {
          return piVar4;
        }
        piVar4 = (istream *)std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
        return piVar4;
      }
      if (iVar3 == 10) {
        return piVar4;
      }
      if (iVar3 == 0xd) break;
      std::__cxx11::string::push_back((char)t);
    }
    if ((byte *)plVar1[2] < (byte *)plVar1[3]) {
      piVar4 = (istream *)(ulong)*(byte *)plVar1[2];
    }
    else {
      piVar4 = (istream *)(**(code **)(*plVar1 + 0x48))(plVar1);
    }
    if ((int)piVar4 == 10) {
      if ((ulong)plVar1[2] < (ulong)plVar1[3]) {
        piVar4 = (istream *)(plVar1[2] + 1);
        plVar1[2] = (long)piVar4;
      }
      else {
        piVar4 = (istream *)(**(code **)(*plVar1 + 0x50))(plVar1);
      }
    }
  }
  return piVar4;
}

Assistant:

static std::istream &safeGetline(std::istream &is, std::string &t) {
  t.clear();

  // The characters in the stream are read one-by-one using a std::streambuf.
  // That is faster than reading them one-by-one using the std::istream.
  // Code that uses streambuf this way must be guarded by a sentry object.
  // The sentry object performs various tasks,
  // such as thread synchronization and updating the stream state.

  std::istream::sentry se(is, true);
  std::streambuf *sb = is.rdbuf();

  if (se) {
    for (;;) {
      int c = sb->sbumpc();
      switch (c) {
        case '\n':
          return is;
        case '\r':
          if (sb->sgetc() == '\n') sb->sbumpc();
          return is;
        case EOF:
          // Also handle the case when the last line has no line ending
          if (t.empty()) is.setstate(std::ios::eofbit);
          return is;
        default:
          t += static_cast<char>(c);
      }
    }
  }

  return is;
}